

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O2

void __thiscall
QTreeWidgetItemPrivate::updateHiddenStatus
          (QTreeWidgetItemPrivate *this,QTreeWidgetItem *item,bool inserting)

{
  QTreeView *this_00;
  int row;
  QTreeModel *__s;
  value_type pQVar1;
  int i;
  ulong uVar2;
  long in_FS_OFFSET;
  QModelIndex local_90;
  undefined1 *local_78;
  undefined1 *puStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  QArrayDataPointer<QTreeWidgetItem_*> local_58;
  QTreeWidgetItemIterator **local_38;
  
  local_38 = *(QTreeWidgetItemIterator ***)(in_FS_OFFSET + 0x28);
  __s = QTreeWidgetItem::treeModel(item,(QTreeWidget *)0x0);
  if (__s != (QTreeModel *)0x0) {
    local_58.d = (Data *)0x0;
    local_58.ptr = (QTreeWidgetItem **)0x0;
    local_58.size = 0;
    QList<QTreeWidgetItem_*>::append((QList<QTreeWidgetItem_*> *)&local_58,item);
    while (local_58.size != 0) {
      pQVar1 = QList<QTreeWidgetItem_*>::takeLast((QList<QTreeWidgetItem_*> *)&local_58);
      if ((pQVar1->d->field_0x20 & 4) != 0) {
        local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
        QTreeModel::index((QTreeModel *)&local_78,(char *)__s,(int)pQVar1);
        this_00 = &item->view->super_QTreeView;
        row = (int)local_78;
        QModelIndex::parent(&local_90,(QModelIndex *)&local_78);
        QTreeView::setRowHidden(this_00,row,&local_90,inserting);
      }
      for (uVar2 = 0; uVar2 < (ulong)(pQVar1->children).d.size; uVar2 = uVar2 + 1) {
        QList<QTreeWidgetItem_*>::append
                  ((QList<QTreeWidgetItem_*> *)&local_58,(pQVar1->children).d.ptr[uVar2]);
      }
    }
    QArrayDataPointer<QTreeWidgetItem_*>::~QArrayDataPointer(&local_58);
  }
  if (*(QTreeWidgetItemIterator ***)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeWidgetItemPrivate::updateHiddenStatus(QTreeWidgetItem *item, bool inserting)
{
    QTreeModel *model = item->treeModel();
    if (!model)
        return;
    QStack<QTreeWidgetItem *> parents;
    parents.push(item);
    while (!parents.isEmpty()) {
        QTreeWidgetItem *parent = parents.pop();
        if (parent->d->hidden) {
            const QModelIndex index = model->index(parent, 0);
            item->view->setRowHidden(index.row(), index.parent(), inserting);
        }
        for (int i = 0; i < parent->children.size(); ++i) {
            QTreeWidgetItem *child = parent->children.at(i);
            parents.push(child);
        }
    }
}